

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  int *piVar1;
  size_type *psVar2;
  const_iterator __begin2;
  int *piVar3;
  long *in_R9;
  long lVar4;
  StringRef enums;
  int value;
  tuple<Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_> local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  
  local_50 = values;
  psVar2 = (size_type *)operator_new(0x28);
  psVar2[4] = 0;
  psVar2[2] = 0;
  psVar2[3] = 0;
  (((EnumInfo *)enumName.m_start)->m_name).m_start = (char *)psVar2;
  *psVar2 = enumName.m_size;
  psVar2[1] = (size_type)allValueNames.m_start;
  local_58.
  super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>.
  super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
       (_Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
       enumName.m_start;
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
           *)(psVar2 + 2),in_R9[1] - *in_R9 >> 2);
  enums.m_size = (size_type)local_50;
  enums.m_start = (char *)allValueNames.m_size;
  parseEnums(&valueNames,enums);
  piVar3 = (int *)*in_R9;
  piVar1 = (int *)in_R9[1];
  if ((long)valueNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)valueNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
            _M_impl.super__Vector_impl_data._M_start >> 4 == (long)piVar1 - (long)piVar3 >> 2) {
    lVar4 = 0;
    for (; piVar3 != piVar1; piVar3 = piVar3 + 1) {
      value = *piVar3;
      std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
      emplace_back<int&,Catch::StringRef_const&>
                ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                  *)(psVar2 + 2),&value,
                 (StringRef *)
                 ((long)&(valueNames.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_start + lVar4));
      lVar4 = lVar4 + 0x10;
    }
    clara::std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base
              (&valueNames.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>);
    return (__uniq_ptr_data<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>,_true,_true>
            )(tuple<Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>)
             local_58.
             super__Tuple_impl<0UL,_Catch::Detail::EnumInfo_*,_std::default_delete<Catch::Detail::EnumInfo>_>
             .super__Head_base<0UL,_Catch::Detail::EnumInfo_*,_false>._M_head_impl;
  }
  __assert_fail("valueNames.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/catch.hpp"
                ,0x2986,
                "std::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
               );
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }